

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_4bf6b6::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  long lVar1;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  string local_58;
  byte local_31;
  long lStack_30;
  bool updated;
  long OldPercentage;
  string *status_local;
  double total_local;
  double value_local;
  cURLProgressHelper *this_local;
  
  lStack_30 = this->CurrentPercentage;
  OldPercentage = (long)status;
  status_local = (string *)total;
  total_local = value;
  value_local = (double)this;
  if (0.0 < total) {
    lVar1 = lround((value / total) * 100.0);
    this->CurrentPercentage = lVar1;
    if (100 < this->CurrentPercentage) {
      this->CurrentPercentage = 100;
    }
  }
  local_31 = lStack_30 != this->CurrentPercentage;
  if ((bool)local_31) {
    cmAlphaNum::cmAlphaNum(&local_88,"[");
    cmAlphaNum::cmAlphaNum(&local_b8,&this->Text);
    cmStrCat<char[2],long,char[12]>
              (&local_58,&local_88,&local_b8,(char (*) [2])0xdcf81f,&this->CurrentPercentage,
               (char (*) [12])"% complete]");
    std::__cxx11::string::operator=((string *)OldPercentage,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool UpdatePercentage(double value, double total, std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0.0) {
      this->CurrentPercentage = std::lround(value / total * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      status =
        cmStrCat("[", this->Text, " ", this->CurrentPercentage, "% complete]");
    }

    return updated;
  }